

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int MemHashConfigure(unqlite_kv_engine *pKvEngine,int iOp,__va_list_tag *ap)

{
  uint uVar1;
  int iVar2;
  long *plVar3;
  long lVar4;
  long lVar5;
  
  if (iOp == 2) {
    uVar1 = ap->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      plVar3 = (long *)((ulong)uVar1 + (long)ap->reg_save_area);
      ap->gp_offset = uVar1 + 8;
    }
    else {
      plVar3 = (long *)ap->overflow_arg_area;
      ap->overflow_arg_area = plVar3 + 1;
    }
    lVar4 = *plVar3;
    lVar5 = 200;
  }
  else {
    iVar2 = -0xd;
    if ((iOp != 1) || (iVar2 = -4, *(int *)&pKvEngine[0x1a].pIo != 0)) {
      return iVar2;
    }
    uVar1 = ap->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      plVar3 = (long *)((ulong)uVar1 + (long)ap->reg_save_area);
      ap->gp_offset = uVar1 + 8;
    }
    else {
      plVar3 = (long *)ap->overflow_arg_area;
      ap->overflow_arg_area = plVar3 + 1;
    }
    lVar4 = *plVar3;
    lVar5 = 0xc0;
  }
  if (lVar4 != 0) {
    *(long *)((long)&pKvEngine->pIo + lVar5) = lVar4;
  }
  return 0;
}

Assistant:

static int MemHashConfigure(unqlite_kv_engine *pKvEngine,int iOp,va_list ap)
{
	mem_hash_kv_engine *pEngine = (mem_hash_kv_engine *)pKvEngine;
	int rc = UNQLITE_OK;
	switch(iOp){
	case UNQLITE_KV_CONFIG_HASH_FUNC:{
		/* Use a default hash function */
		if( pEngine->nRecord > 0 ){
			rc = UNQLITE_LOCKED;
		}else{
			ProcHash xHash = va_arg(ap,ProcHash);
			if( xHash ){
				pEngine->xHash = xHash;
			}
		}
		break;
									 }
	case UNQLITE_KV_CONFIG_CMP_FUNC: {
		/* Default comparison function */
		ProcCmp xCmp = va_arg(ap,ProcCmp);
		if( xCmp ){
			pEngine->xCmp = xCmp;
		}
		break;
									 }
	default:
		/* Unknown configuration option */
		rc = UNQLITE_UNKNOWN;
	}
	return rc;
}